

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS
ref_split_edge_tri_conformity
          (REF_BOOL verbose,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,
          REF_BOOL *allowed)

{
  REF_GEOM ref_geom;
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_NODE ref_node;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  int iVar8;
  char *pcVar9;
  REF_INT RVar10;
  ulong uVar11;
  REF_DBL uv_area;
  REF_DBL uv_area0;
  REF_DBL sign_uv_area;
  REF_NODE local_d8;
  ulong local_d0;
  REF_DBL normdev1;
  REF_DBL uv_area1;
  REF_DBL normdev0;
  REF_DBL normdev;
  REF_INT nodes [27];
  
  local_d8 = ref_grid->node;
  ref_geom = ref_grid->geom;
  *allowed = 0;
  if (0 < ref_geom->n) {
    pRVar1 = ref_grid->cell[3];
    local_d0 = (ulong)(uint)node0;
    uVar11 = 0xffffffff;
    RVar10 = -1;
    if (-1 < node0) {
      pRVar2 = pRVar1->ref_adj;
      uVar11 = 0xffffffff;
      RVar10 = -1;
      if (node0 < pRVar2->nnode) {
        uVar4 = pRVar2->first[local_d0];
        uVar11 = 0xffffffff;
        RVar10 = -1;
        if ((long)(int)uVar4 != -1) {
          RVar10 = pRVar2->item[(int)uVar4].ref;
          uVar11 = (ulong)uVar4;
        }
      }
    }
    while ((int)uVar11 != -1) {
      for (iVar8 = 0; iVar8 < pRVar1->node_per; iVar8 = iVar8 + 1) {
        if (pRVar1->c2n[pRVar1->size_per * RVar10 + iVar8] == node1) {
          uVar4 = ref_cell_nodes(pRVar1,RVar10,nodes);
          if (uVar4 != 0) {
            pcVar9 = "cell nodes";
            uVar7 = 0x301;
            goto LAB_001d5958;
          }
          uVar4 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev);
          if (uVar4 != 0) {
            pcVar9 = "nd";
            uVar7 = 0x302;
            goto LAB_001d5958;
          }
          for (lVar5 = 0; lVar5 < pRVar1->node_per; lVar5 = lVar5 + 1) {
            if (nodes[lVar5] == node0) {
              nodes[lVar5] = new_node;
            }
          }
          uVar4 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev0);
          if (uVar4 != 0) {
            pcVar9 = "nd0";
            uVar7 = 0x306;
            goto LAB_001d5958;
          }
          for (lVar5 = 0; uVar6 = (ulong)pRVar1->node_per, lVar5 < (long)uVar6; lVar5 = lVar5 + 1) {
            if (nodes[lVar5] == new_node) {
              nodes[lVar5] = node0;
            }
          }
          for (lVar5 = 0; lVar5 < (int)uVar6; lVar5 = lVar5 + 1) {
            if (nodes[lVar5] == node1) {
              nodes[lVar5] = new_node;
              uVar6 = (ulong)(uint)pRVar1->node_per;
            }
          }
          uVar4 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev1);
          if (uVar4 != 0) {
            pcVar9 = "nd1";
            uVar7 = 0x30d;
            goto LAB_001d5958;
          }
          if (((normdev0 <= normdev) && (normdev0 < ref_grid->adapt->post_min_normdev)) ||
             ((normdev1 <= normdev && (normdev1 < ref_grid->adapt->post_min_normdev)))) {
            if (verbose != 0) {
              printf("nd %f %f %f\n",normdev,normdev0,normdev1);
            }
            *allowed = 0;
            return 0;
          }
        }
      }
      pRVar3 = pRVar1->ref_adj->item;
      uVar11 = (ulong)pRVar3[(int)uVar11].next;
      RVar10 = -1;
      if (uVar11 != 0xffffffffffffffff) {
        RVar10 = pRVar3[uVar11].ref;
      }
    }
    if ((0 < ref_geom->n) && (ref_geom->meshlink == (void *)0x0)) {
      pRVar1 = ref_grid->cell[3];
      uVar11 = 0xffffffff;
      RVar10 = -1;
      if (-1 < node0) {
        pRVar2 = pRVar1->ref_adj;
        uVar11 = 0xffffffff;
        RVar10 = -1;
        if (node0 < pRVar2->nnode) {
          uVar4 = pRVar2->first[local_d0];
          uVar11 = 0xffffffff;
          RVar10 = -1;
          if ((long)(int)uVar4 != -1) {
            RVar10 = pRVar2->item[(int)uVar4].ref;
            uVar11 = (ulong)uVar4;
          }
        }
      }
      while ((int)uVar11 != -1) {
        for (iVar8 = 0; iVar8 < pRVar1->node_per; iVar8 = iVar8 + 1) {
          if (pRVar1->c2n[pRVar1->size_per * RVar10 + iVar8] == node1) {
            uVar4 = ref_cell_nodes(pRVar1,RVar10,nodes);
            if (uVar4 != 0) {
              pcVar9 = "cell nodes";
              uVar7 = 0x31d;
LAB_001d5958:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,uVar7,"ref_split_edge_tri_conformity",(ulong)uVar4,pcVar9);
              return uVar4;
            }
            uVar4 = ref_geom_uv_area(ref_geom,nodes,&uv_area);
            if (uVar4 != 0) {
              pcVar9 = "uv area";
              uVar7 = 0x31e;
              goto LAB_001d5958;
            }
            uVar4 = ref_geom_uv_area_sign(ref_grid,nodes[3],&sign_uv_area);
            if (uVar4 != 0) {
              pcVar9 = "sign";
              uVar7 = 799;
              goto LAB_001d5958;
            }
            uv_area = sign_uv_area * uv_area;
            for (lVar5 = 0; lVar5 < pRVar1->node_per; lVar5 = lVar5 + 1) {
              if (nodes[lVar5] == node0) {
                nodes[lVar5] = new_node;
              }
            }
            uVar4 = ref_geom_uv_area(ref_geom,nodes,&uv_area0);
            if (uVar4 != 0) {
              pcVar9 = "uv area";
              uVar7 = 0x324;
              goto LAB_001d5958;
            }
            uVar4 = ref_geom_uv_area_sign(ref_grid,nodes[3],&sign_uv_area);
            if (uVar4 != 0) {
              pcVar9 = "sign";
              uVar7 = 0x325;
              goto LAB_001d5958;
            }
            uv_area0 = sign_uv_area * uv_area0;
            for (lVar5 = 0; uVar6 = (ulong)pRVar1->node_per, lVar5 < (long)uVar6; lVar5 = lVar5 + 1)
            {
              if (nodes[lVar5] == new_node) {
                nodes[lVar5] = node0;
              }
            }
            for (lVar5 = 0; lVar5 < (int)uVar6; lVar5 = lVar5 + 1) {
              if (nodes[lVar5] == node1) {
                nodes[lVar5] = new_node;
                uVar6 = (ulong)(uint)pRVar1->node_per;
              }
            }
            uVar4 = ref_geom_uv_area(ref_geom,nodes,&uv_area1);
            if (uVar4 != 0) {
              pcVar9 = "uv area";
              uVar7 = 0x32d;
              goto LAB_001d5958;
            }
            uVar4 = ref_geom_uv_area_sign(ref_grid,nodes[3],&sign_uv_area);
            if (uVar4 != 0) {
              pcVar9 = "sign";
              uVar7 = 0x32e;
              goto LAB_001d5958;
            }
            uv_area1 = sign_uv_area * uv_area1;
            if ((uv_area0 <= local_d8->min_uv_area) || (uv_area1 <= local_d8->min_uv_area)) {
              *allowed = 0;
              if (verbose != 0) {
                printf("area orig %e new %e %e\n",uv_area);
                ref_node = local_d8;
                ref_node_location(local_d8,node0);
                ref_node_location(ref_node,node1);
                return 0;
              }
              return 0;
            }
          }
        }
        pRVar3 = pRVar1->ref_adj->item;
        uVar11 = (ulong)pRVar3[(int)uVar11].next;
        RVar10 = -1;
        if (uVar11 != 0xffffffffffffffff) {
          RVar10 = pRVar3[uVar11].ref;
        }
      }
    }
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tri_conformity(REF_BOOL verbose,
                                                 REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_INT new_node,
                                                 REF_BOOL *allowed) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL sign_uv_area, uv_area0, uv_area1, uv_area;
  REF_DBL normdev, normdev0, normdev1;

  *allowed = REF_FALSE;

  if (0 < ref_geom_n(ref_geom)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "nd");

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev0), "nd0");

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (new_node == nodes[node]) nodes[node] = node0;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node1 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev1), "nd1");

      if ((normdev0 <= normdev &&
           normdev0 < ref_grid_adapt(ref_grid, post_min_normdev)) ||
          (normdev1 <= normdev &&
           normdev1 < ref_grid_adapt(ref_grid, post_min_normdev))) {
        if (verbose) printf("nd %f %f %f\n", normdev, normdev0, normdev1);
        *allowed = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  if (0 < ref_geom_n(ref_geom) && !ref_geom_meshlinked(ref_geom)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area0), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area0 *= sign_uv_area;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (new_node == nodes[node]) nodes[node] = node0;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node1 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area1), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area1 *= sign_uv_area;

      if (ref_node_min_uv_area(ref_node) >= uv_area0 ||
          ref_node_min_uv_area(ref_node) >= uv_area1) {
        *allowed = REF_FALSE;
        if (verbose) {
          printf("area orig %e new %e %e\n", uv_area, uv_area0, uv_area1);
          ref_node_location(ref_node, node0);
          ref_node_location(ref_node, node1);
        }
        return REF_SUCCESS;
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}